

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

Amap_Gat_t * Amap_LibFindGate(Amap_Lib_t *p,uint uTruth)

{
  int iVar1;
  Amap_Gat_t *pAVar2;
  int local_2c;
  int i;
  Amap_Gat_t *pGate;
  uint uTruth_local;
  Amap_Lib_t *p_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vSorted);
    if (iVar1 <= local_2c) {
      return (Amap_Gat_t *)0x0;
    }
    pAVar2 = (Amap_Gat_t *)Vec_PtrEntry(p->vSorted,local_2c);
    if ((((pAVar2 != (Amap_Gat_t *)0x0) && (pAVar2->pFunc != (uint *)0x0)) &&
        (*(uint *)&pAVar2->field_0x38 >> 0x18 < 6)) && (*pAVar2->pFunc == uTruth)) break;
    local_2c = local_2c + 1;
  }
  return pAVar2;
}

Assistant:

Amap_Gat_t * Amap_LibFindGate( Amap_Lib_t * p, unsigned uTruth )
{
    Amap_Gat_t * pGate;
    int i;
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if (( pGate == NULL ) || ( pGate->pFunc == NULL )) continue;
        if ( pGate->nPins <= 5 && pGate->pFunc[0] == uTruth )
            return pGate;
    }
    return NULL;
}